

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

int check_neighbor_blocks(MB_MODE_INFO **mi,int mi_stride,TileInfo *tile_info,int mi_row,int mi_col)

{
  MV MVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  byte local_4d;
  int_mv left_mv;
  MB_MODE_INFO *left_mbmi;
  int_mv above_mv;
  MB_MODE_INFO *above_mbmi;
  int thr;
  int is_left_low_motion;
  int is_above_low_motion;
  int mi_col_local;
  int mi_row_local;
  TileInfo *tile_info_local;
  int mi_stride_local;
  MB_MODE_INFO **mi_local;
  
  bVar2 = true;
  bVar3 = 1;
  if ((tile_info->mi_row_start < mi_row) &&
     (MVar1 = mi[-mi_stride]->mv[0].as_mv, 0xc < mi[-mi_stride]->mode)) {
    above_mv.as_mv.row = MVar1.row;
    iVar4 = (int)above_mv.as_mv.row;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    if (iVar4 < 0x19) {
      above_mv.as_mv.col = MVar1.col;
      iVar4 = (int)above_mv.as_mv.col;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (iVar4 < 0x19) goto LAB_00206dc9;
    }
    bVar2 = false;
  }
LAB_00206dc9:
  if ((tile_info->mi_col_start < mi_col) && (MVar1 = mi[-1]->mv[0].as_mv, 0xc < mi[-1]->mode)) {
    left_mv.as_mv.row = MVar1.row;
    iVar4 = (int)left_mv.as_mv.row;
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    if (iVar4 < 0x19) {
      left_mv.as_mv.col = MVar1.col;
      iVar4 = (int)left_mv.as_mv.col;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (iVar4 < 0x19) goto LAB_00206e2b;
    }
    bVar3 = 0;
  }
LAB_00206e2b:
  local_4d = 0;
  if (bVar2) {
    local_4d = bVar3;
  }
  return (int)local_4d;
}

Assistant:

static int check_neighbor_blocks(MB_MODE_INFO **mi, int mi_stride,
                                 const TileInfo *const tile_info, int mi_row,
                                 int mi_col) {
  int is_above_low_motion = 1;
  int is_left_low_motion = 1;
  const int thr = 24;

  // Check above block.
  if (mi_row > tile_info->mi_row_start) {
    const MB_MODE_INFO *above_mbmi = mi[-mi_stride];
    const int_mv above_mv = above_mbmi->mv[0];
    if (above_mbmi->mode >= INTRA_MODE_END &&
        (abs(above_mv.as_mv.row) > thr || abs(above_mv.as_mv.col) > thr))
      is_above_low_motion = 0;
  }

  // Check left block.
  if (mi_col > tile_info->mi_col_start) {
    const MB_MODE_INFO *left_mbmi = mi[-1];
    const int_mv left_mv = left_mbmi->mv[0];
    if (left_mbmi->mode >= INTRA_MODE_END &&
        (abs(left_mv.as_mv.row) > thr || abs(left_mv.as_mv.col) > thr))
      is_left_low_motion = 0;
  }

  return (is_above_low_motion && is_left_low_motion);
}